

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SegReaderCursor(Fts3Table *p,int iLangid,int iIndex,int iLevel,char *zTerm,int nTerm,
                       int isPrefix,int isScan,Fts3MultiSegReader *pCsr)

{
  u64 n;
  Fts3Hash *pH;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fts3SegReader **ppFVar6;
  Mem *pMVar7;
  i64 iVar8;
  char *zNode;
  Fts3SegReader *pFVar9;
  sqlite3_int64 *piLeaf2;
  ulong iValue;
  int iVar10;
  uint uVar11;
  size_t __nmemb;
  Fts3SegReader **pOld;
  long in_FS_OFFSET;
  bool bVar12;
  sqlite3_int64 iLeavesEndBlock;
  sqlite3_int64 iStartBlock;
  Fts3SegReader *pSeg;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  if (((iLevel < 0) && (iVar3 = 0, p->aIndex != (Fts3Index *)0x0)) && (p->iPrevLangid == iLangid)) {
    pSeg = (Fts3SegReader *)&DAT_aaaaaaaaaaaaaaaa;
    pH = &p->aIndex[iIndex].hPending;
    if (isScan == 0 && isPrefix == 0) {
      pSeg = (Fts3SegReader *)sqlite3Fts3HashFindElem(pH,zTerm,nTerm);
      pOld = &pSeg;
      uVar11 = (uint)(pSeg != (Fts3SegReader *)0x0);
      if (pSeg == (Fts3SegReader *)0x0) {
        pOld = (Fts3SegReader **)0x0;
      }
      iVar3 = 0;
    }
    else {
      pSeg = (Fts3SegReader *)pH->first;
      if (pSeg == (Fts3SegReader *)0x0) {
        __nmemb = 0;
        iVar3 = 0;
        pOld = (Fts3SegReader **)0x0;
      }
      else {
        pOld = (Fts3SegReader **)0x0;
        iVar5 = 0;
        iVar3 = 0;
        __nmemb = 0;
        iVar4 = iVar3;
        do {
          iVar10 = (int)__nmemb;
          iVar1 = iVar4;
          if ((nTerm == 0) ||
             ((bVar12 = false, nTerm <= (int)pSeg->iCurrentBlock &&
              (iVar2 = bcmp((void *)pSeg->iEndBlock,zTerm,(long)nTerm), iVar2 == 0)))) {
            ppFVar6 = pOld;
            iVar2 = iVar3;
            if (iVar10 == iVar5) {
              iVar5 = iVar5 + 0x10;
              iVar3 = sqlite3_initialize();
              if (iVar3 == 0) {
                ppFVar6 = (Fts3SegReader **)sqlite3Realloc(pOld,(long)iVar5 << 3);
              }
              else {
                ppFVar6 = (Fts3SegReader **)0x0;
              }
              bVar12 = ppFVar6 == (Fts3SegReader **)0x0;
              if (bVar12) {
                __nmemb = 0;
              }
              iVar10 = (int)__nmemb;
              iVar3 = 7;
              iVar2 = iVar4;
              iVar1 = iVar3;
              if (bVar12) goto LAB_001c2d99;
            }
            iVar3 = iVar2;
            __nmemb = (size_t)(iVar10 + 1);
            ppFVar6[iVar10] = pSeg;
            bVar12 = false;
            pOld = ppFVar6;
            iVar1 = iVar4;
          }
LAB_001c2d99:
          iVar4 = iVar1;
        } while ((!bVar12) && (pSeg = *(Fts3SegReader **)pSeg, pSeg != (Fts3SegReader *)0x0));
      }
      uVar11 = (uint)__nmemb;
      if (1 < (int)uVar11) {
        qsort(pOld,__nmemb,8,fts3CompareElemByTerm);
      }
    }
    if ((int)uVar11 < 1) {
      pFVar9 = (Fts3SegReader *)0x0;
    }
    else {
      n = (ulong)uVar11 * 8 + 0x90;
      iVar4 = sqlite3_initialize();
      if (iVar4 == 0) {
        pFVar9 = (Fts3SegReader *)sqlite3Malloc(n);
      }
      else {
        pFVar9 = (Fts3SegReader *)0x0;
      }
      if (pFVar9 == (Fts3SegReader *)0x0) {
        iVar3 = 7;
      }
      else {
        memset(pFVar9,0,n);
        pFVar9->iIdx = 0x7fffffff;
        pFVar9->ppNextElem = (Fts3HashElem **)(pFVar9 + 1);
        memcpy(pFVar9 + 1,pOld,(ulong)uVar11 << 3);
      }
    }
    if (isScan != 0 || isPrefix != 0) {
      sqlite3_free(pOld);
    }
    if ((iVar3 == 0) && (pFVar9 != (Fts3SegReader *)0x0)) {
      iVar3 = fts3SegReaderCursorAppend(pCsr,pFVar9);
    }
  }
  if (iLevel == -1) {
    pFVar9 = (Fts3SegReader *)0x0;
  }
  else {
    if (iVar3 == 0) {
      pSeg = (Fts3SegReader *)0x0;
      if (iLevel < 0) {
        iVar3 = fts3SqlStmt(p,0xd,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
        pFVar9 = pSeg;
        if (iVar3 == 0) {
          sqlite3_bind_int64((sqlite3_stmt *)pSeg,1,
                             ((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400);
          iValue = ((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400 | 0x3ff;
          iVar3 = 2;
          goto LAB_001c2eba;
        }
      }
      else {
        iVar3 = fts3SqlStmt(p,0xc,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
        pFVar9 = pSeg;
        if (iVar3 == 0) {
          iValue = (ulong)(uint)iLevel + ((long)iIndex + (long)p->nIndex * (long)iLangid) * 0x400;
          iVar3 = 1;
LAB_001c2eba:
          sqlite3_bind_int64((sqlite3_stmt *)pFVar9,iVar3,iValue);
          pFVar9 = pSeg;
          iVar3 = 0;
        }
      }
    }
    else {
      pFVar9 = (Fts3SegReader *)0x0;
    }
    piLeaf2 = &iLeavesEndBlock;
    if (isPrefix == 0) {
      piLeaf2 = (sqlite3_int64 *)0x0;
    }
    do {
      if ((iVar3 != 0) || (iVar3 = sqlite3_step((sqlite3_stmt *)pFVar9), iVar3 != 100))
      goto LAB_001c3073;
      pSeg = (Fts3SegReader *)0x0;
      pMVar7 = columnMem((sqlite3_stmt *)pFVar9,1);
      iVar8 = sqlite3VdbeIntValue(pMVar7);
      columnMallocFailure((sqlite3_stmt *)pFVar9);
      iStartBlock = iVar8;
      pMVar7 = columnMem((sqlite3_stmt *)pFVar9,2);
      iVar8 = sqlite3VdbeIntValue(pMVar7);
      columnMallocFailure((sqlite3_stmt *)pFVar9);
      iLeavesEndBlock = iVar8;
      pMVar7 = columnMem((sqlite3_stmt *)pFVar9,3);
      iVar8 = sqlite3VdbeIntValue(pMVar7);
      columnMallocFailure((sqlite3_stmt *)pFVar9);
      iVar4 = sqlite3_column_bytes((sqlite3_stmt *)pFVar9,4);
      pMVar7 = columnMem((sqlite3_stmt *)pFVar9,4);
      zNode = (char *)sqlite3_value_blob(pMVar7);
      columnMallocFailure((sqlite3_stmt *)pFVar9);
      if ((zTerm == (char *)0x0) || ((iStartBlock == 0 || (zNode == (char *)0x0)))) {
LAB_001c300d:
        iVar3 = sqlite3Fts3SegReaderNew
                          (pCsr->nSegment + 1,(uint)(isScan == 0 && isPrefix == 0),iStartBlock,
                           iLeavesEndBlock,iVar8,zNode,iVar4,&pSeg);
        if (iVar3 == 0) {
          iVar3 = fts3SegReaderCursorAppend(pCsr,pSeg);
          iVar5 = 0;
        }
        else {
          iVar5 = 4;
        }
      }
      else {
        iVar3 = fts3SelectLeaf(p,zTerm,nTerm,zNode,iVar4,&iStartBlock,piLeaf2);
        if (iVar3 == 0 && (isScan == 0 && isPrefix == 0)) {
          iLeavesEndBlock = iStartBlock;
          iVar5 = 0;
        }
        else {
          iVar5 = (uint)(iVar3 != 0) << 2;
        }
        if (iVar3 == 0) goto LAB_001c300d;
      }
    } while (iVar5 == 0);
    if (iVar5 != 4) goto LAB_001c3083;
  }
LAB_001c3073:
  iVar5 = sqlite3_reset((sqlite3_stmt *)pFVar9);
  if (iVar3 != 0x65) {
    iVar5 = iVar3;
  }
LAB_001c3083:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int fts3SegReaderCursor(
  Fts3Table *p,                   /* FTS3 table handle */
  int iLangid,                    /* Language id */
  int iIndex,                     /* Index to search (from 0 to p->nIndex-1) */
  int iLevel,                     /* Level of segments to scan */
  const char *zTerm,              /* Term to query for */
  int nTerm,                      /* Size of zTerm in bytes */
  int isPrefix,                   /* True for a prefix search */
  int isScan,                     /* True to scan from zTerm to EOF */
  Fts3MultiSegReader *pCsr        /* Cursor object to populate */
){
  int rc = SQLITE_OK;             /* Error code */
  sqlite3_stmt *pStmt = 0;        /* Statement to iterate through segments */
  int rc2;                        /* Result of sqlite3_reset() */

  /* If iLevel is less than 0 and this is not a scan, include a seg-reader
  ** for the pending-terms. If this is a scan, then this call must be being
  ** made by an fts4aux module, not an FTS table. In this case calling
  ** Fts3SegReaderPending might segfault, as the data structures used by
  ** fts4aux are not completely populated. So it's easiest to filter these
  ** calls out here.  */
  if( iLevel<0 && p->aIndex && p->iPrevLangid==iLangid ){
    Fts3SegReader *pSeg = 0;
    rc = sqlite3Fts3SegReaderPending(p, iIndex, zTerm, nTerm, isPrefix||isScan, &pSeg);
    if( rc==SQLITE_OK && pSeg ){
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3AllSegdirs(p, iLangid, iIndex, iLevel, &pStmt);
    }

    while( rc==SQLITE_OK && SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
      Fts3SegReader *pSeg = 0;

      /* Read the values returned by the SELECT into local variables. */
      sqlite3_int64 iStartBlock = sqlite3_column_int64(pStmt, 1);
      sqlite3_int64 iLeavesEndBlock = sqlite3_column_int64(pStmt, 2);
      sqlite3_int64 iEndBlock = sqlite3_column_int64(pStmt, 3);
      int nRoot = sqlite3_column_bytes(pStmt, 4);
      char const *zRoot = sqlite3_column_blob(pStmt, 4);

      /* If zTerm is not NULL, and this segment is not stored entirely on its
      ** root node, the range of leaves scanned can be reduced. Do this. */
      if( iStartBlock && zTerm && zRoot ){
        sqlite3_int64 *pi = (isPrefix ? &iLeavesEndBlock : 0);
        rc = fts3SelectLeaf(p, zTerm, nTerm, zRoot, nRoot, &iStartBlock, pi);
        if( rc!=SQLITE_OK ) goto finished;
        if( isPrefix==0 && isScan==0 ) iLeavesEndBlock = iStartBlock;
      }

      rc = sqlite3Fts3SegReaderNew(pCsr->nSegment+1,
          (isPrefix==0 && isScan==0),
          iStartBlock, iLeavesEndBlock,
          iEndBlock, zRoot, nRoot, &pSeg
      );
      if( rc!=SQLITE_OK ) goto finished;
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

 finished:
  rc2 = sqlite3_reset(pStmt);
  if( rc==SQLITE_DONE ) rc = rc2;

  return rc;
}